

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QStorageInfoPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QStorageInfoPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QStorageInfoPrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QExplicitlySharedDataPointer<QStorageInfoPrivate> *in_RDI;
  void *in_R8;
  QStorageInfoPrivate *x;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffffe0;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref(in_stack_ffffffffffffffe0);
  Qt::totally_ordered_wrapper<QStorageInfoPrivate_*>::operator->
            ((totally_ordered_wrapper<QStorageInfoPrivate_*> *)0x2f5fb5);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x2f5fbd);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QStorageInfoPrivate_*>::get(&in_RDI->d),
     this_00 != (QStorageInfoPrivate *)0x0)) {
    QStorageInfoPrivate::~QStorageInfoPrivate(this_00);
    operator_delete(this_00,0xa0);
  }
  Qt::totally_ordered_wrapper<QStorageInfoPrivate_*>::reset
            (&in_RDI->d,(QStorageInfoPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}